

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

bool __thiscall slang::parsing::Parser::isConditionalExpression(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  undefined8 in_RAX;
  TokenKind end;
  uint32_t offset;
  Token TVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  offset = 1;
  do {
    uStack_38 = CONCAT44(offset + 1,(undefined4)uStack_38);
    TVar3 = ParserBase::peek(&this->super_ParserBase,offset);
    TVar2 = TVar3.kind;
    switch(TVar2) {
    case OpenBrace:
      TVar2 = OpenBrace;
      end = CloseBrace;
      break;
    case OpenBracket:
      TVar2 = OpenBracket;
      end = CloseBracket;
      break;
    case OpenParenthesis:
      TVar2 = OpenParenthesis;
      end = CloseParenthesis;
      break;
    case CloseParenthesis:
      return false;
    default:
      if (TVar2 == Question) {
        return true;
      }
    case CloseBrace:
    case CloseBracket:
    case OpenParenthesisStar:
      bVar1 = slang::syntax::SyntaxFacts::isNotInType(TVar2);
      if (bVar1) {
        return false;
      }
      goto LAB_002aca6a;
    }
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                      (this,(uint32_t *)((long)&uStack_38 + 4),TVar2,end);
    if (!bVar1) {
      return false;
    }
LAB_002aca6a:
    offset = uStack_38._4_4_;
  } while( true );
}

Assistant:

bool Parser::isConditionalExpression() {
    uint32_t index = 1;
    while (true) {
        TokenKind kind = peek(index++).kind;
        switch (kind) {
            case TokenKind::Question:
                return true;
            case TokenKind::CloseParenthesis:
                return false;
            case TokenKind::OpenParenthesis:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                               TokenKind::CloseParenthesis)) {
                    return false;
                }
                break;
            case TokenKind::OpenBrace:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBrace,
                                               TokenKind::CloseBrace)) {
                    return false;
                }
                break;
            case TokenKind::OpenBracket:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBracket,
                                               TokenKind::CloseBracket)) {
                    return false;
                }
                break;
            default:
                if (isNotInType(kind))
                    return false;
                break;
        }
    }
}